

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBelief.cpp
# Opt level: O2

double __thiscall
JointBelief::Update(JointBelief *this,MultiAgentDecisionProcessDiscreteInterface *pu,Index lastJAI,
                   Index newJOI)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  char cVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  Index sI;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double Pso_ba;
  vector<double,_std::allocator<double>_> newJB_unnorm;
  value_type_conflict3 local_78;
  Index local_6c;
  double local_68;
  double local_60;
  ulong local_58;
  double local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c = newJOI;
  local_58 = (**(code **)((long)*pu + 0x30))(pu);
  plVar7 = (long *)(**(code **)((long)*pu + 0x110))(pu);
  if (plVar7 == (long *)0x0) {
    local_68 = 0.0;
    for (uVar8 = 0; uVar8 < local_58; uVar8 = (ulong)((int)uVar8 + 1)) {
      local_78 = 0.0;
      cVar5 = (**(code **)((long)*pu + 0x140))(pu);
      if (cVar5 == '\0') {
        local_50 = (double)(**(code **)((long)*pu + 0x118))(pu,lastJAI,uVar8,local_6c);
        auVar12 = ZEXT816(0);
        uVar6 = 0;
        while( true ) {
          uVar9 = (ulong)uVar6;
          if (local_58 <= uVar9) break;
          local_60 = auVar12._0_8_;
          auVar15._0_8_ = (**(code **)((long)*pu + 0x108))(pu,uVar9,lastJAI,uVar8);
          auVar15._8_56_ = extraout_var_00;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_60;
          auVar12._8_8_ = 0;
          auVar12._0_8_ =
               *(ulong *)(*(long *)(&this->field_0x10 + *(long *)(*(long *)this + -0xd8)) +
                         uVar9 * 8);
          auVar12 = vfmadd231sd_fma(auVar19,auVar15._0_16_,auVar12);
          uVar6 = uVar6 + 1;
        }
        local_78 = auVar12._0_8_ * local_50;
      }
      else {
        uVar6 = 0;
        while (uVar9 = (ulong)uVar6, uVar9 < local_58) {
          local_60 = (double)(**(code **)((long)*pu + 0x120))(pu,uVar9,lastJAI,uVar8,local_6c);
          dVar10 = (double)(**(code **)((long)*pu + 0x108))(pu,uVar6,lastJAI,uVar8);
          auVar18._8_8_ = 0;
          auVar18._0_8_ =
               *(ulong *)(*(long *)(&this->field_0x10 + *(long *)(*(long *)this + -0xd8)) +
                         uVar9 * 8);
          uVar6 = uVar6 + 1;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_78;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = dVar10 * local_60;
          auVar12 = vfmadd213sd_fma(auVar18,auVar13,auVar3);
          local_78 = auVar12._0_8_;
        }
      }
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_48,&local_78);
      local_68 = local_68 + local_78;
    }
  }
  else {
    local_68 = 0.0;
    for (uVar8 = 0; uVar8 < local_58; uVar8 = (ulong)((int)uVar8 + 1)) {
      local_78 = 0.0;
      cVar5 = (**(code **)((long)*pu + 0x140))(pu);
      if (cVar5 == '\0') {
        local_50 = (double)(**(code **)((long)*pu + 0x118))(pu,lastJAI,uVar8,local_6c);
        auVar12 = ZEXT816(0);
        uVar6 = 0;
        while( true ) {
          uVar9 = (ulong)uVar6;
          if (local_58 <= uVar9) break;
          local_60 = auVar12._0_8_;
          auVar14._0_8_ = (**(code **)(*plVar7 + 0x10))(plVar7,uVar9,lastJAI,uVar8);
          auVar14._8_56_ = extraout_var;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_60;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(*(long *)(&this->field_0x10 + *(long *)(*(long *)this + -0xd8))
                                   + uVar9 * 8);
          auVar12 = vfmadd231sd_fma(auVar17,auVar14._0_16_,auVar2);
          uVar6 = uVar6 + 1;
        }
        local_78 = auVar12._0_8_ * local_50;
      }
      else {
        uVar6 = 0;
        while (uVar9 = (ulong)uVar6, uVar9 < local_58) {
          local_60 = (double)(**(code **)((long)*pu + 0x120))(pu,uVar9,lastJAI,uVar8,local_6c);
          dVar10 = (double)(**(code **)(*plVar7 + 0x10))(plVar7,uVar6,lastJAI,uVar8);
          auVar16._8_8_ = 0;
          auVar16._0_8_ =
               *(ulong *)(*(long *)(&this->field_0x10 + *(long *)(*(long *)this + -0xd8)) +
                         uVar9 * 8);
          uVar6 = uVar6 + 1;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_78;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = dVar10 * local_60;
          auVar12 = vfmadd213sd_fma(auVar16,auVar11,auVar1);
          local_78 = auVar12._0_8_;
        }
      }
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_48,&local_78);
      local_68 = local_68 + local_78;
    }
  }
  if (0.0 < local_68) {
    lVar4 = *(long *)this;
    for (uVar6 = 0; uVar8 = (ulong)uVar6, uVar8 < local_58; uVar6 = uVar6 + 1) {
      *(double *)(*(long *)(&this->field_0x10 + *(long *)(lVar4 + -0xd8)) + uVar8 * 8) =
           local_48._M_impl.super__Vector_impl_data._M_start[uVar8] / local_68;
    }
  }
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 8))(plVar7);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return local_68;
}

Assistant:

double JointBelief::Update(const MultiAgentDecisionProcessDiscreteInterface &pu,
                           Index lastJAI, Index newJOI)
{
    double Po_ba = 0.0; // P(o|b,a) with o=newJO
    vector<double> newJB_unnorm;
    size_t nrS = pu.GetNrStates();
    
    TGet* T = 0;
    T = pu.GetTGet();
    if(T != 0)
    {
        for(Index sI=0; sI < nrS; sI++)
        {
            double Pso_ba = 0.0;
            if(!pu.GetEventObservability())
            {
                //P(newJOI | lastJAI, sI) :
                double Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);
                //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
                double Ps_ba = 0.0;
                //for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //Ps_ba += T->Get(it.index(), lastJAI, sI) * *it;
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                    Ps_ba += T->Get(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                //Ps_ba += pu.GetTransitionProbability(prec_sI, lastJAI, sI) * 
                //_m_b[prec_sI];

                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
            else
            {
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                {
                    //P(newJOI | prec_sI, lastJAI, sI) :
                    double Po_sas = pu.GetObservationProbability(prec_sI, lastJAI, sI, newJOI);
                    //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                    Pso_ba += Po_sas * T->Get(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                }
            }
            newJB_unnorm.push_back(Pso_ba); //unormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
    }
    else 
    {
        for(Index sI=0; sI < nrS; sI++)
        {
            double Pso_ba = 0.0;
            if(!pu.GetEventObservability())
            {
                //P(newJOI | lastJAI, sI) :
                double Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);
                //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
                double Ps_ba = 0.0;
                //for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //Ps_ba += T->Get(it.index(), lastJAI, sI) * *it;
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                  Ps_ba += pu.GetTransitionProbability(prec_sI, lastJAI, sI) * 
                    _m_b[prec_sI];
                
                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
            else
            {
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                {
                    //P(newJOI | prec_sI, lastJAI, sI) :
                    double Po_sas = pu.GetObservationProbability(prec_sI, lastJAI, sI, newJOI);
                    //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                    Pso_ba += Po_sas * pu.GetTransitionProbability(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                }
            }                
            newJB_unnorm.push_back(Pso_ba); //unormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
        //throw E("JointBelief::Update tried to obtain a TGet, but apparently the transition model is not cached? (it should be, since this belief update loops over all states it should be possible to cache the transition model)");
    }
   
    //normalize:
    if(Po_ba>0)
        for(Index sI=0; sI < nrS; sI++)
            _m_b[sI]=newJB_unnorm[sI]/Po_ba;

    delete T;

#if JointBelief_doSanityCheckAfterEveryUpdate
    if(!SanityCheck())
        throw(E("JointBelief::Update SanityCheck failed"));
#endif

    return(Po_ba);
}